

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O0

void __thiscall
btHashMap<btHashKey<btTriIndex>,_btTriIndex>::insert
          (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this,btHashKey<btTriIndex> *key,
          btTriIndex *value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int n;
  int iVar4;
  int iVar5;
  btTriIndex *pbVar6;
  int *piVar7;
  undefined8 *in_RDX;
  btHashKey<btTriIndex> *in_RSI;
  btAlignedObjectArray<int> *in_RDI;
  int newCapacity;
  int oldCapacity;
  int count;
  int index;
  int hash;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  btAlignedObjectArray<btTriIndex> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  uVar1 = btHashKey<btTriIndex>::getHash(in_RSI);
  iVar2 = btAlignedObjectArray<btTriIndex>::capacity
                    ((btAlignedObjectArray<btTriIndex> *)(in_RDI + 2));
  uVar3 = uVar1 & iVar2 - 1U;
  iVar2 = findIndex((btHashMap<btHashKey<btTriIndex>,_btTriIndex> *)
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (btHashKey<btTriIndex> *)CONCAT44(in_stack_ffffffffffffffd4,uVar1));
  if (iVar2 == -1) {
    n = btAlignedObjectArray<btTriIndex>::size((btAlignedObjectArray<btTriIndex> *)(in_RDI + 2));
    iVar4 = btAlignedObjectArray<btTriIndex>::capacity
                      ((btAlignedObjectArray<btTriIndex> *)(in_RDI + 2));
    btAlignedObjectArray<btTriIndex>::push_back
              (in_stack_ffffffffffffffc0,
               (btTriIndex *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    btAlignedObjectArray<btHashKey<btTriIndex>_>::push_back
              ((btAlignedObjectArray<btHashKey<btTriIndex>_> *)in_stack_ffffffffffffffc0,
               (btHashKey<btTriIndex> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    iVar5 = btAlignedObjectArray<btTriIndex>::capacity
                      ((btAlignedObjectArray<btTriIndex> *)(in_RDI + 2));
    if (iVar4 < iVar5) {
      growTables((btHashMap<btHashKey<btTriIndex>,_btTriIndex> *)CONCAT44(uVar3,iVar2),
                 (btHashKey<btTriIndex> *)CONCAT44(n,iVar4));
      uVar3 = btHashKey<btTriIndex>::getHash(in_RSI);
      iVar2 = btAlignedObjectArray<btTriIndex>::capacity
                        ((btAlignedObjectArray<btTriIndex> *)(in_RDI + 2));
      uVar3 = uVar3 & iVar2 - 1U;
    }
    piVar7 = btAlignedObjectArray<int>::operator[](in_RDI,uVar3);
    iVar2 = *piVar7;
    piVar7 = btAlignedObjectArray<int>::operator[](in_RDI + 1,n);
    *piVar7 = iVar2;
    piVar7 = btAlignedObjectArray<int>::operator[](in_RDI,uVar3);
    *piVar7 = n;
  }
  else {
    pbVar6 = btAlignedObjectArray<btTriIndex>::operator[]
                       ((btAlignedObjectArray<btTriIndex> *)(in_RDI + 2),iVar2);
    *(undefined8 *)pbVar6 = *in_RDX;
    pbVar6->m_childShape = (btCollisionShape *)in_RDX[1];
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}